

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int btrimws(bstring b)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  ushort **ppuVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  
  if (((b != (bstring)0x0) && (puVar3 = b->data, puVar3 != (uchar *)0x0)) &&
     (iVar6 = b->mlen, 0 < iVar6)) {
    uVar2 = b->slen;
    if (((int)uVar2 <= iVar6) && (uVar5 = (ulong)uVar2, -1 < (int)uVar2)) {
      do {
        uVar8 = uVar5;
        if ((long)uVar8 < 1) {
          *puVar3 = '\0';
          b->slen = 0;
          return 0;
        }
        uVar1 = puVar3[uVar8 - 1];
        if ((long)(char)uVar1 < 0) break;
        ppuVar7 = __ctype_b_loc();
        uVar5 = uVar8 - 1;
      } while ((*(byte *)((long)*ppuVar7 + (long)(char)uVar1 * 2 + 1) & 0x20) != 0);
      if ((int)uVar8 <= iVar6) {
        puVar3[uVar8 & 0xffffffff] = '\0';
      }
      b->slen = (int)uVar8;
      pbVar4 = b->data;
      bVar10 = *pbVar4;
      if ((char)bVar10 < '\0') {
        lVar9 = 0;
      }
      else {
        ppuVar7 = __ctype_b_loc();
        lVar9 = 0;
        do {
          if ((*(byte *)((long)*ppuVar7 + (ulong)bVar10 * 2 + 1) & 0x20) == 0) break;
          bVar10 = pbVar4[lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while (-1 < (char)bVar10);
      }
      iVar6 = bdelete(b,0,(int)lVar9);
      return iVar6;
    }
  }
  return -1;
}

Assistant:

int btrimws (bstring b) {
int i, j;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (i = b->slen - 1; i >= 0; i--) {
		if (!wspace (b->data[i])) {
			if (b->mlen > i) b->data[i+1] = (unsigned char) '\0';
			b->slen = i + 1;
			for (j = 0; wspace (b->data[j]); j++) {}
			return bdelete (b, 0, j);
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return 0;
}